

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

void __thiscall
QStyleSheetBorderImageData::QStyleSheetBorderImageData(QStyleSheetBorderImageData *this)

{
  long in_RDI;
  int i;
  undefined4 local_c;
  
  QSharedData::QSharedData((QSharedData *)0x44951b);
  QPixmap::QPixmap((QPixmap *)(in_RDI + 0x18));
  QImage::QImage((QImage *)(in_RDI + 0x30));
  *(undefined4 *)(in_RDI + 0x48) = 0;
  *(undefined4 *)(in_RDI + 0x4c) = 0;
  for (local_c = 0; local_c < 4; local_c = local_c + 1) {
    *(undefined4 *)(in_RDI + 4 + (long)local_c * 4) = 0xffffffff;
  }
  return;
}

Assistant:

QStyleSheetBorderImageData()
        : horizStretch(QCss::TileMode_Unknown), vertStretch(QCss::TileMode_Unknown)
    {
        for (int i = 0; i < 4; i++)
            cuts[i] = -1;
    }